

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<double> * __thiscall Imath_3_2::Matrix44<double>::transpose(Matrix44<double> *this)

{
  Matrix44<double> *in_RDI;
  Matrix44<double> tmp;
  Matrix44<double> local_88;
  
  Matrix44(&local_88,in_RDI->x[0][0],in_RDI->x[1][0],in_RDI->x[2][0],in_RDI->x[3][0],in_RDI->x[0][1]
           ,in_RDI->x[1][1],in_RDI->x[2][1],in_RDI->x[3][1],in_RDI->x[0][2],in_RDI->x[1][2],
           in_RDI->x[2][2],in_RDI->x[3][2],in_RDI->x[0][3],in_RDI->x[1][3],in_RDI->x[2][3],
           in_RDI->x[3][3]);
  operator=(in_RDI,&local_88);
  return in_RDI;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::transpose () IMATH_NOEXCEPT
{
    Matrix44 tmp (
        x[0][0],
        x[1][0],
        x[2][0],
        x[3][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[3][1],
        x[0][2],
        x[1][2],
        x[2][2],
        x[3][2],
        x[0][3],
        x[1][3],
        x[2][3],
        x[3][3]);
    *this = tmp;
    return *this;
}